

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseXMLDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *str1;
  bool bVar2;
  uint local_1c;
  int c;
  xmlChar *version;
  xmlParserCtxtPtr ctxt_local;
  
  ctxt->standalone = -2;
  ctxt->input->cur = ctxt->input->cur + 5;
  ctxt->input->col = ctxt->input->col + 5;
  if (*ctxt->input->cur == '\0') {
    xmlParserGrow(ctxt);
  }
  if ((*ctxt->input->cur != ' ') &&
     (((*ctxt->input->cur < 9 || (10 < *ctxt->input->cur)) && (*ctxt->input->cur != '\r')))) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed after \'<?xml\'\n");
  }
  xmlSkipBlankChars(ctxt);
  str1 = xmlParseVersionInfo(ctxt);
  if (str1 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_VERSION_MISSING,(char *)0x0);
  }
  else {
    iVar1 = xmlStrEqual(str1,"1.0");
    if (iVar1 == 0) {
      if ((ctxt->options & 0x20000U) == 0) {
        if ((*str1 == '1') && (str1[1] == '.')) {
          xmlWarningMsg(ctxt,XML_WAR_UNKNOWN_VERSION,"Unsupported version \'%s\'\n",str1,
                        (xmlChar *)0x0);
        }
        else {
          xmlFatalErrMsgStr(ctxt,XML_ERR_UNKNOWN_VERSION,"Unsupported version \'%s\'\n",str1);
        }
      }
      else {
        xmlFatalErrMsgStr(ctxt,XML_ERR_UNKNOWN_VERSION,"Unsupported version \'%s\'\n",str1);
      }
    }
    if (ctxt->version != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->version);
    }
    ctxt->version = str1;
  }
  if (((*ctxt->input->cur != ' ') && ((*ctxt->input->cur < 9 || (10 < *ctxt->input->cur)))) &&
     (*ctxt->input->cur != '\r')) {
    if ((*ctxt->input->cur == '?') && (ctxt->input->cur[1] == '>')) {
      ctxt->input->cur = ctxt->input->cur + 2;
      ctxt->input->col = ctxt->input->col + 2;
      if (*ctxt->input->cur != '\0') {
        return;
      }
      xmlParserGrow(ctxt);
      return;
    }
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed here\n");
  }
  xmlParseEncodingDecl(ctxt);
  if ((((ctxt->encoding != (xmlChar *)0x0) && (*ctxt->input->cur != ' ')) &&
      ((*ctxt->input->cur < 9 || (10 < *ctxt->input->cur)))) && (*ctxt->input->cur != '\r')) {
    if ((*ctxt->input->cur == '?') && (ctxt->input->cur[1] == '>')) {
      ctxt->input->cur = ctxt->input->cur + 2;
      ctxt->input->col = ctxt->input->col + 2;
      if (*ctxt->input->cur != '\0') {
        return;
      }
      xmlParserGrow(ctxt);
      return;
    }
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed here\n");
  }
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  xmlSkipBlankChars(ctxt);
  iVar1 = xmlParseSDDecl(ctxt);
  ctxt->standalone = iVar1;
  xmlSkipBlankChars(ctxt);
  if ((*ctxt->input->cur == '?') && (ctxt->input->cur[1] == '>')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
  }
  else if (*ctxt->input->cur == '>') {
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
    xmlNextChar(ctxt);
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
    do {
      bVar2 = false;
      if (ctxt->disableSAX < 2) {
        local_1c = (uint)*ctxt->input->cur;
        bVar2 = local_1c != 0;
      }
    } while ((bVar2) && (xmlNextChar(ctxt), local_1c != 0x3e));
  }
  return;
}

Assistant:

void
xmlParseXMLDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;

    /*
     * This value for standalone indicates that the document has an
     * XML declaration but it does not have a standalone attribute.
     * It will be overwritten later if a standalone attribute is found.
     */

    ctxt->standalone = -2;

    /*
     * We know that '<?xml' is here.
     */
    SKIP(5);

    if (!IS_BLANK_CH(RAW)) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
	               "Blank needed after '<?xml'\n");
    }
    SKIP_BLANKS;

    /*
     * We must have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL) {
	xmlFatalErr(ctxt, XML_ERR_VERSION_MISSING, NULL);
    } else {
	if (!xmlStrEqual(version, (const xmlChar *) XML_DEFAULT_VERSION)) {
	    /*
	     * Changed here for XML-1.0 5th edition
	     */
	    if (ctxt->options & XML_PARSE_OLD10) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_UNKNOWN_VERSION,
			          "Unsupported version '%s'\n",
			          version);
	    } else {
	        if ((version[0] == '1') && ((version[1] == '.'))) {
		    xmlWarningMsg(ctxt, XML_WAR_UNKNOWN_VERSION,
		                  "Unsupported version '%s'\n",
				  version, NULL);
		} else {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_UNKNOWN_VERSION,
				      "Unsupported version '%s'\n",
				      version);
		}
	    }
	}
	if (ctxt->version != NULL)
	    xmlFree((void *) ctxt->version);
	ctxt->version = version;
    }

    /*
     * We may have the encoding declaration
     */
    if (!IS_BLANK_CH(RAW)) {
        if ((RAW == '?') && (NXT(1) == '>')) {
	    SKIP(2);
	    return;
	}
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
    }
    xmlParseEncodingDecl(ctxt);

    /*
     * We may have the standalone status.
     */
    if ((ctxt->encoding != NULL) && (!IS_BLANK_CH(RAW))) {
        if ((RAW == '?') && (NXT(1) == '>')) {
	    SKIP(2);
	    return;
	}
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
    }

    /*
     * We can grow the input buffer freely at that point
     */
    GROW;

    SKIP_BLANKS;
    ctxt->standalone = xmlParseSDDecl(ctxt);

    SKIP_BLANKS;
    if ((RAW == '?') && (NXT(1) == '>')) {
        SKIP(2);
    } else if (RAW == '>') {
        /* Deprecated old WD ... */
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	NEXT;
    } else {
        int c;

	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
        while ((PARSER_STOPPED(ctxt) == 0) &&
               ((c = CUR) != 0)) {
            NEXT;
            if (c == '>')
                break;
        }
    }
}